

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void store_update(void)

{
  uint32_t uVar1;
  void *p;
  uint32_t local_1c;
  wchar_t n_without_home;
  int *non_home_inds;
  wchar_t n;
  
  if (((player->opts).opt[0x1a] & 1U) != 0) {
    msg("Updating Shops...");
  }
  while (daycount != 0) {
    daycount = daycount - 1;
    for (non_home_inds._4_4_ = 0; non_home_inds._4_4_ < (int)(uint)z_info->store_max;
        non_home_inds._4_4_ = non_home_inds._4_4_ + 1) {
      if (stores[non_home_inds._4_4_].feat != 0xe) {
        store_maint(stores + non_home_inds._4_4_);
      }
    }
    uVar1 = Rand_div((uint)z_info->store_shuffle);
    if (uVar1 == 0) {
      p = mem_zalloc((ulong)z_info->store_max << 2);
      local_1c = 0;
      if (((player->opts).opt[0x1a] & 1U) != 0) {
        msg("Shuffling a Shopkeeper...");
      }
      for (non_home_inds._4_4_ = 0; non_home_inds._4_4_ < (int)(uint)z_info->store_max;
          non_home_inds._4_4_ = non_home_inds._4_4_ + 1) {
        if (stores[non_home_inds._4_4_].feat != 0xe) {
          *(int *)((long)p + (long)(int)local_1c * 4) = non_home_inds._4_4_;
          local_1c = local_1c + 1;
        }
      }
      if (0 < (int)local_1c) {
        uVar1 = Rand_div(local_1c);
        store_shuffle(stores + *(int *)((long)p + (long)(int)uVar1 * 4));
      }
      mem_free(p);
    }
  }
  daycount = 0;
  if (((player->opts).opt[0x1a] & 1U) != 0) {
    msg("Done.");
  }
  return;
}

Assistant:

void store_update(void)
{
	if (OPT(player, cheat_xtra)) msg("Updating Shops...");
	while (daycount--) {
		int n;

		/* Maintain each shop (except home) */
		for (n = 0; n < z_info->store_max; n++) {
			/* Skip the home */
			if (stores[n].feat == FEAT_HOME) continue;

			/* Maintain */
			store_maint(&stores[n]);
		}

		/* Sometimes, shuffle the shop-keepers */
		if (one_in_(z_info->store_shuffle)) {
			int *non_home_inds = mem_zalloc(z_info->store_max
				* sizeof(*non_home_inds));
			int n_without_home = 0;

			/* Message */
			if (OPT(player, cheat_xtra)) msg("Shuffling a Shopkeeper...");

			/* Pick a random shop (except home) */
			for (n = 0; n < z_info->store_max; n++) {
				if (stores[n].feat != FEAT_HOME) {
					non_home_inds[n_without_home] = n;
					++n_without_home;
				}
			}
			if (n_without_home > 0) {
				n = randint0(n_without_home);
				/* Then suffle it. */
				store_shuffle(&stores[non_home_inds[n]]);
			}
			mem_free(non_home_inds);
		}
	}
	daycount = 0;
	if (OPT(player, cheat_xtra)) msg("Done.");
}